

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O2

void __thiscall
ConfusableMatcher::GetMappings
          (ConfusableMatcher *this,CMStringView Key,size_t KeyPos,CMStringView Value,size_t ValuePos
          ,StackVector<std::pair<unsigned_long,_unsigned_long>_> *Storage)

{
  byte bVar1;
  pointer ppVar2;
  vector<CMString,_std::allocator<CMString>_> *pvVar3;
  pointer pCVar4;
  int iVar5;
  pointer ppVar6;
  int i;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  pair<unsigned_long,_unsigned_long> In;
  CMStringView Compare;
  CMStringView local_70;
  iterator local_60;
  iterator foundArr;
  
  if (Key._M_len == KeyPos) {
    __assert_fail("Key.size() - KeyPos >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                  ,0xf8,
                  "void ConfusableMatcher::GetMappings(const CMStringView, size_t, const CMStringView, size_t, StackVector<std::pair<size_t, size_t>> &)"
                 );
  }
  if (Value._M_len == ValuePos) {
    __assert_fail("Value.size() - ValuePos >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                  ,0xf9,
                  "void ConfusableMatcher::GetMappings(const CMStringView, size_t, const CMStringView, size_t, StackVector<std::pair<size_t, size_t>> &)"
                 );
  }
  bVar1 = Key._M_str[KeyPos];
  for (uVar8 = 0;
      ppVar2 = this->TheMap[bVar1].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)this->TheMap[bVar1].
                            super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 5);
      uVar8 = uVar8 + 1) {
    if (*(ulong *)((long)(ppVar2 + uVar8) + 8) <= Key._M_len - KeyPos) {
      ppVar6 = ppVar2 + uVar8;
      iVar5 = strncmp((ppVar6->first).Str,Key._M_str + KeyPos,*(ulong *)((long)(ppVar2 + uVar8) + 8)
                     );
      if (iVar5 == 0) {
        google::
        dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
        ::find(&foundArr,&ppVar6->second->rep,Value._M_str + ValuePos);
        google::
        dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
        ::end(&local_60,&ppVar6->second->rep);
        if (foundArr.pos != local_60.pos) {
          pvVar3 = (foundArr.pos)->second;
          lVar9 = 8;
          for (uVar7 = 0;
              pCVar4 = (pvVar3->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                       super__Vector_impl_data._M_start,
              uVar7 < (ulong)(((long)(pvVar3->
                                     super__Vector_base<CMString,_std::allocator<CMString>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) /
                             0x18); uVar7 = uVar7 + 1) {
            if (*(ulong *)((long)&pCVar4->Str + lVar9) <= Value._M_len - ValuePos) {
              std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              basic_string_view(&local_70,Value._M_str);
              Compare._M_str = *(char **)((long)pCVar4 + lVar9 + -8);
              Compare._M_len = *(size_t *)((long)&pCVar4->Str + lVar9);
              iVar5 = StrCompareWithSkips(this,local_70,ValuePos,Compare);
              if (iVar5 != -1) {
                In.second = (unsigned_long)iVar5;
                In.first = *(size_t *)((long)&ppVar6->first + 8);
                StackVector<std::pair<unsigned_long,_unsigned_long>_>::Push(Storage,In);
              }
            }
            lVar9 = lVar9 + 0x18;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ConfusableMatcher::GetMappings(const CMStringView Key, size_t KeyPos, const CMStringView Value, size_t ValuePos, StackVector<std::pair<size_t, size_t>> &Storage)
{
	assert(Key.size() - KeyPos >= 1);
	assert(Value.size() - ValuePos >= 1);

	// Find array of whole keys
	const auto &vec = TheMap[(unsigned char)Key[KeyPos]];

	for (auto x = 0;x < vec.size();x++) {
		const auto &item = vec[x];

		if (item.first.Len <= Key.size() - KeyPos && strncmp(item.first.Str, Key.data() + KeyPos, item.first.Len) == 0) {
			// Whole key found, search for value array
			auto foundArr = item.second->find(Value[ValuePos]);
			if (foundArr == item.second->end())
				continue;

			const auto &secondVec = *(foundArr->second);

			for (auto i = 0;i < secondVec.size();i++) {
				const auto &secondItem = secondVec[i];

				if (secondItem.Len > Value.size() - ValuePos)
					continue;

				auto valLen = StrCompareWithSkips(Value.data(), ValuePos, secondItem.View());

				if (valLen != -1)
					Storage.Push(std::pair<size_t, size_t>((item.first).Len, valLen)); // Whole value found
			}
		}
	}
}